

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O2

result<toml::detail::region,_toml::detail::none_t> *
toml::detail::
repeat<toml::detail::exclude<toml::detail::either<toml::detail::in_range<'\x00',_'\b'>,_toml::detail::in_range<'\n',_'\x1f'>,_toml::detail::character<'"'>,_toml::detail::character<'\\'>,_toml::detail::character<'\x7f'>_>_>,_toml::detail::unlimited>
::invoke(result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,location *loc)

{
  bool bVar1;
  region *other;
  region retval;
  result<toml::detail::region,_toml::detail::none_t> rslt;
  region local_110;
  result<toml::detail::region,_toml::detail::none_t> local_c8;
  region local_78;
  
  region::region(&local_110,loc);
  do {
    exclude<toml::detail::either<toml::detail::in_range<'\x00',_'\b'>,_toml::detail::in_range<'\n',_'\x1f'>,_toml::detail::character<'"'>,_toml::detail::character<'\\'>,_toml::detail::character<'\x7f'>_>_>
    ::invoke(&local_c8,loc);
    bVar1 = local_c8.is_ok_;
    if (local_c8.is_ok_ == false) {
      region::region(&local_78,&local_110);
      other = &local_78;
      result<toml::detail::region,_toml::detail::none_t>::result
                (__return_storage_ptr__,(success_type *)&local_78);
      region::~region(&local_78);
    }
    else {
      other = result<toml::detail::region,_toml::detail::none_t>::unwrap(&local_c8);
      region::operator+=(&local_110,other);
    }
    result<toml::detail::region,_toml::detail::none_t>::cleanup(&local_c8,(EVP_PKEY_CTX *)other);
  } while (bVar1 != false);
  region::~region(&local_110);
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc)
    {
        region retval(loc);
        while(true)
        {
            auto rslt = T::invoke(loc);
            if(rslt.is_err())
            {
                return ok(std::move(retval));
            }
            retval += rslt.unwrap();
        }
    }